

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O1

void duckdb::MarkBlocksAsUsed(BlockManager *manager,PersistentColumnData *col_data)

{
  pointer pDVar1;
  pointer plVar2;
  pointer pPVar3;
  pointer pCVar4;
  long *block;
  pointer plVar5;
  DataPointer *pointer;
  pointer pDVar6;
  pointer col_data_00;
  
  pDVar1 = (col_data->pointers).
           super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
           super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pDVar6 = (col_data->pointers).
                super_vector<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
                super__Vector_base<duckdb::DataPointer,_std::allocator<duckdb::DataPointer>_>.
                _M_impl.super__Vector_impl_data._M_start; pDVar6 != pDVar1; pDVar6 = pDVar6 + 1) {
    if ((pDVar6->block_pointer).block_id != -1) {
      (*manager->_vptr_BlockManager[8])(manager);
    }
    if ((pDVar6->segment_state).
        super_unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ColumnSegmentState_*,_std::default_delete<duckdb::ColumnSegmentState>_>
        .super__Head_base<0UL,_duckdb::ColumnSegmentState_*,_false>._M_head_impl !=
        (ColumnSegmentState *)0x0) {
      pCVar4 = unique_ptr<duckdb::ColumnSegmentState,_std::default_delete<duckdb::ColumnSegmentState>,_true>
               ::operator->(&pDVar6->segment_state);
      plVar2 = (pCVar4->blocks).super_vector<long,_std::allocator<long>_>.
               super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      for (plVar5 = (pCVar4->blocks).super_vector<long,_std::allocator<long>_>.
                    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                    _M_start; plVar5 != plVar2; plVar5 = plVar5 + 1) {
        (*manager->_vptr_BlockManager[8])(manager,*plVar5);
      }
    }
  }
  pPVar3 = (col_data->child_columns).
           super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
           .
           super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (col_data_00 = (col_data->child_columns).
                     super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                     .
                     super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                     ._M_impl.super__Vector_impl_data._M_start; col_data_00 != pPVar3;
      col_data_00 = col_data_00 + 1) {
    MarkBlocksAsUsed(manager,col_data_00);
  }
  return;
}

Assistant:

static void MarkBlocksAsUsed(BlockManager &manager, const PersistentColumnData &col_data) {
	for (auto &pointer : col_data.pointers) {
		auto block_id = pointer.block_pointer.block_id;
		if (block_id != INVALID_BLOCK) {
			manager.MarkBlockAsUsed(block_id);
		}
		if (pointer.segment_state) {
			for (auto &block : pointer.segment_state->blocks) {
				manager.MarkBlockAsUsed(block);
			}
		}
	}
	for (auto &child_column : col_data.child_columns) {
		MarkBlocksAsUsed(manager, child_column);
	}
}